

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O3

void luaC_fullgc(lua_State *L,int isemergency)

{
  lu_byte lVar1;
  global_State *g;
  long lVar2;
  long lVar3;
  long lVar4;
  
  g = L->l_G;
  lVar1 = g->gckind;
  if (isemergency == 0) {
    g->gckind = '\0';
    callallpendingfinalizers(L,1);
    if (g->gckind != '\x02') goto LAB_0010a937;
  }
  else {
    g->gckind = '\x01';
LAB_0010a937:
    if (1 < g->gcstate) goto LAB_0010a946;
  }
  entersweep(L);
LAB_0010a946:
  luaC_runtilstate(L,0x20);
  luaC_runtilstate(L,-0x21);
  luaC_runtilstate(L,0x20);
  if (lVar1 == '\x02') {
    luaC_runtilstate(L,1);
  }
  g->gckind = lVar1;
  lVar4 = g->GCdebt + g->totalbytes;
  lVar2 = lVar4 / 100;
  lVar3 = lVar2 * g->gcpause;
  if (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7ffffffffffffffc)) / SEXT816(lVar2),0) <=
      (long)g->gcpause) {
    lVar3 = 0x7ffffffffffffffc;
  }
  luaE_setdebt(g,lVar4 - lVar3);
  if (isemergency != 0) {
    return;
  }
  callallpendingfinalizers(L,1);
  return;
}

Assistant:

void luaC_fullgc (lua_State *L, int isemergency) {
  global_State *g = G(L);
  int origkind = g->gckind;
  lua_assert(origkind != KGC_EMERGENCY);
  if (isemergency)  /* do not run finalizers during emergency GC */
    g->gckind = KGC_EMERGENCY;
  else {
    g->gckind = KGC_NORMAL;
    callallpendingfinalizers(L, 1);
  }
  if (keepinvariant(g)) {  /* may there be some black objects? */
    /* must sweep all objects to turn them back to white
       (as white has not changed, nothing will be collected) */
    entersweep(L);
  }
  /* finish any pending sweep phase to start a new cycle */
  luaC_runtilstate(L, bitmask(GCSpause));
  luaC_runtilstate(L, ~bitmask(GCSpause));  /* start new collection */
  luaC_runtilstate(L, bitmask(GCSpause));  /* run entire collection */
  if (origkind == KGC_GEN) {  /* generational mode? */
    /* generational mode must be kept in propagate phase */
    luaC_runtilstate(L, bitmask(GCSpropagate));
  }
  g->gckind = origkind;
  setpause(g, gettotalbytes(g));
  if (!isemergency)   /* do not run finalizers during emergency GC */
    callallpendingfinalizers(L, 1);
}